

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HouseholderSequence.h
# Opt level: O2

void __thiscall
Eigen::HouseholderSequence<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,1>
::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           *this,Matrix<double,__1,__1,_0,__1,__1> *dst,Matrix<double,__1,_1,_0,__1,_1> *workspace)

{
  long lVar1;
  long cRows;
  long k_00;
  long lVar2;
  Index k;
  long lVar3;
  EssentialVectorType local_d0;
  Matrix<double,__1,__1,_0,__1,__1> *local_98 [13];
  
  PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
             *(Index *)(*(long *)this + 8));
  k_00 = *(long *)(this + 0x18);
  lVar2 = (*(long **)this)[1];
  if (((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data ==
       (double *)**(long **)this) &&
     ((dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows ==
      lVar2)) {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::diagonal
              ((DiagonalReturnType *)local_98,
               (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst);
    DenseBase<Eigen::Diagonal<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>_>::setOnes
              ((DenseBase<Eigen::Diagonal<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_> *)local_98)
    ;
    local_98[0] = dst;
    TriangularViewImpl<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_10U,_Eigen::Dense>::setZero
              ((TriangularViewImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_10U,_Eigen::Dense> *)
               local_98);
    lVar1 = -k_00;
    lVar2 = k_00 * 8;
    lVar3 = k_00;
    while (lVar2 = lVar2 + -8, 0 < lVar3) {
      lVar3 = lVar3 + -1;
      cRows = lVar1 + (*(long *)(*(long *)this + 8) - *(long *)(this + 0x20)) + 1;
      if (this[0x10] ==
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           )0x1) {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  ((Type *)local_98,dst,cRows,cRows);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_d0,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,lVar3);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   local_98,&local_d0,(Scalar *)(**(long **)(this + 8) + lVar2),
                   (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
      }
      else {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  ((Type *)local_98,dst,cRows,cRows);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_d0,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,lVar3);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   local_98,&local_d0,(Scalar *)(**(long **)(this + 8) + lVar2),
                   (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
      }
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_d0,dst,lVar3
                );
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                ((Type *)local_98,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_d0,*(long *)(*(long *)this + 8) + lVar1);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                 *)local_98);
      lVar1 = lVar1 + 1;
    }
    lVar2 = -1;
    for (lVar3 = 0; lVar3 < *(long *)(*(long *)this + 8) - k_00; lVar3 = lVar3 + 1) {
      Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)&local_d0,dst,lVar3
                );
      DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                ((Type *)local_98,
                 (DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_d0,*(long *)(*(long *)this + 8) + lVar2);
      DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
      ::setZero((DenseBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                 *)local_98);
      lVar2 = lVar2 + -1;
    }
  }
  else {
    MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::setIdentity
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)dst,lVar2,lVar2);
    if (0x30 < k_00) {
      applyThisOnTheLeft<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (this,dst,workspace,true);
      return;
    }
    lVar3 = -k_00;
    lVar2 = k_00 * 8;
    while( true ) {
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + -8;
      if (k_00 < 1) break;
      k_00 = k_00 + -1;
      lVar1 = (*(long *)(*(long *)this + 8) - *(long *)(this + 0x20)) + lVar3;
      if (this[0x10] ==
          (HouseholderSequence<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,1>
           )0x1) {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  ((Type *)local_98,dst,lVar1,lVar1);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_d0,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,k_00);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   local_98,&local_d0,(Scalar *)(**(long **)(this + 8) + lVar2),
                   (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
      }
      else {
        DenseBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::bottomRightCorner<long,long>
                  ((Type *)local_98,dst,lVar1,lVar1);
        HouseholderSequence<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>
        ::essentialVector(&local_d0,
                          (HouseholderSequence<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1>
                           *)this,k_00);
        MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
        applyHouseholderOnTheLeft<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,false>>
                  ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *)
                   local_98,&local_d0,(Scalar *)(**(long **)(this + 8) + lVar2),
                   (workspace->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data);
      }
    }
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
    void evalTo(Dest& dst, Workspace& workspace) const
    {
      workspace.resize(rows());
      Index vecs = m_length;
      if(internal::is_same_dense(dst,m_vectors))
      {
        // in-place
        dst.diagonal().setOnes();
        dst.template triangularView<StrictlyUpper>().setZero();
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());

          // clear the off diagonal vector
          dst.col(k).tail(rows()-k-1).setZero();
        }
        // clear the remaining columns if needed
        for(Index k = 0; k<cols()-vecs ; ++k)
          dst.col(k).tail(rows()-k-1).setZero();
      }
      else if(m_length>BlockSize)
      {
        dst.setIdentity(rows(), rows());
        if(m_reverse)
          applyThisOnTheLeft(dst,workspace,true);
        else
          applyThisOnTheLeft(dst,workspace,true);
      }
      else
      {
        dst.setIdentity(rows(), rows());
        for(Index k = vecs-1; k >= 0; --k)
        {
          Index cornerSize = rows() - k - m_shift;
          if(m_reverse)
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheRight(essentialVector(k), m_coeffs.coeff(k), workspace.data());
          else
            dst.bottomRightCorner(cornerSize, cornerSize)
               .applyHouseholderOnTheLeft(essentialVector(k), m_coeffs.coeff(k), workspace.data());
        }
      }
    }